

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::containerEnd(JSONReactor *this,JSON *value)

{
  bool bVar1;
  reference pvVar2;
  qpdf_offset_t qVar3;
  allocator<char> local_1b9;
  state_e state;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  state_e local_1c;
  JSON *pJStack_18;
  state_e from_state;
  JSON *value_local;
  JSONReactor *this_local;
  
  pJStack_18 = value;
  value_local = (JSON *)this;
  pvVar2 = std::
           vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
           back(&this->stack);
  local_1c = pvVar2->state;
  std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::
  pop_back(&this->stack);
  bVar1 = std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ::empty(&this->stack);
  if (bVar1) {
    if ((this->saw_qpdf & 1U) == 0) {
      QTC::TC("qpdf","QPDF_json missing qpdf",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"\"qpdf\" object was not seen",&local_41);
      error(this,0,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    else {
      if ((this->saw_json_version & 1U) == 0) {
        QTC::TC("qpdf","QPDF_json missing json version",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"\"qpdf[0].jsonversion\" was not seen",&local_79);
        error(this,0,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
      }
      if (((this->must_be_complete & 1U) != 0) && ((this->saw_pdf_version & 1U) == 0)) {
        QTC::TC("qpdf","QPDF_json missing pdf version",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"\"qpdf[0].pdfversion\" was not seen",&local_a1);
        error(this,0,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      if ((this->saw_objects & 1U) == 0) {
        QTC::TC("qpdf","QPDF_json missing objects",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"\"qpdf[1]\" was not seen",&local_c9);
        error(this,0,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator(&local_c9);
      }
      else if (((this->must_be_complete & 1U) != 0) && ((this->saw_trailer & 1U) == 0)) {
        QTC::TC("qpdf","QPDF_json missing trailer",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"\"qpdf[1].trailer\" was not seen",&local_f1);
        error(this,0,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
    }
  }
  else if (local_1c == st_trailer) {
    if ((this->saw_value & 1U) == 0) {
      QTC::TC("qpdf","QPDF_json trailer no value",0);
      qVar3 = JSON::getStart(pJStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"\"trailer\" is missing \"value\"",&local_119);
      error(this,qVar3,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
  }
  else if (local_1c == st_object_top) {
    if ((this->saw_value & 1U) == (this->saw_stream & 1U)) {
      QTC::TC("qpdf","QPDF_json value stream both or neither",0);
      qVar3 = JSON::getStart(pJStack_18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"object must have exactly one of \"value\" or \"stream\"",
                 &local_141);
      error(this,qVar3,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    if ((this->saw_stream & 1U) != 0) {
      if ((this->saw_dict & 1U) == 0) {
        QTC::TC("qpdf","QPDF_json stream no dict",0);
        qVar3 = JSON::getStart(pJStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"\"stream\" is missing \"dict\"",&local_169);
        error(this,qVar3,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
      }
      if ((this->saw_data & 1U) == (this->saw_datafile & 1U)) {
        if ((this->this_stream_needs_data & 1U) == 0) {
          if ((this->saw_datafile & 1U) == 0) {
            QTC::TC("qpdf","QPDF_json no stream data in update mode",0);
          }
          else {
            QTC::TC("qpdf","QPDF_json data and datafile",0);
            qVar3 = JSON::getStart(pJStack_18);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&state,
                       "existing \"stream\" may at most one of \"data\" or \"datafile\"",&local_1b9)
            ;
            error(this,qVar3,(string *)&state);
            std::__cxx11::string::~string((string *)&state);
            std::allocator<char>::~allocator(&local_1b9);
          }
        }
        else {
          QTC::TC("qpdf","QPDF_json data datafile both or neither",0);
          qVar3 = JSON::getStart(pJStack_18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_190,
                     "new \"stream\" must have exactly one of \"data\" or \"datafile\"",&local_191);
          error(this,qVar3,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
        }
      }
    }
  }
  bVar1 = std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ::empty(&this->stack);
  if ((!bVar1) &&
     (pvVar2 = std::
               vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
               ::back(&this->stack), pvVar2->state == st_objects)) {
    std::__cxx11::string::operator=((string *)&this->cur_object,"");
    this->saw_dict = false;
    this->saw_data = false;
    this->saw_datafile = false;
    this->saw_value = false;
    this->saw_stream = false;
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::containerEnd(JSON const& value)
{
    auto from_state = stack.back().state;
    stack.pop_back();
    if (stack.empty()) {
        if (!this->saw_qpdf) {
            QTC::TC("qpdf", "QPDF_json missing qpdf");
            error(0, "\"qpdf\" object was not seen");
        } else {
            if (!this->saw_json_version) {
                QTC::TC("qpdf", "QPDF_json missing json version");
                error(0, "\"qpdf[0].jsonversion\" was not seen");
            }
            if (must_be_complete && !this->saw_pdf_version) {
                QTC::TC("qpdf", "QPDF_json missing pdf version");
                error(0, "\"qpdf[0].pdfversion\" was not seen");
            }
            if (!this->saw_objects) {
                QTC::TC("qpdf", "QPDF_json missing objects");
                error(0, "\"qpdf[1]\" was not seen");
            } else {
                if (must_be_complete && !this->saw_trailer) {
                    QTC::TC("qpdf", "QPDF_json missing trailer");
                    error(0, "\"qpdf[1].trailer\" was not seen");
                }
            }
        }
    } else if (from_state == st_trailer) {
        if (!saw_value) {
            QTC::TC("qpdf", "QPDF_json trailer no value");
            error(value.getStart(), "\"trailer\" is missing \"value\"");
        }
    } else if (from_state == st_object_top) {
        if (saw_value == saw_stream) {
            QTC::TC("qpdf", "QPDF_json value stream both or neither");
            error(value.getStart(), "object must have exactly one of \"value\" or \"stream\"");
        }
        if (saw_stream) {
            if (!saw_dict) {
                QTC::TC("qpdf", "QPDF_json stream no dict");
                error(value.getStart(), "\"stream\" is missing \"dict\"");
            }
            if (saw_data == saw_datafile) {
                if (this_stream_needs_data) {
                    QTC::TC("qpdf", "QPDF_json data datafile both or neither");
                    error(
                        value.getStart(),
                        "new \"stream\" must have exactly one of \"data\" or \"datafile\"");
                } else if (saw_datafile) {
                    QTC::TC("qpdf", "QPDF_json data and datafile");
                    error(
                        value.getStart(),
                        "existing \"stream\" may at most one of \"data\" or \"datafile\"");
                } else {
                    QTC::TC("qpdf", "QPDF_json no stream data in update mode");
                }
            }
        }
    }
    if (!stack.empty()) {
        auto state = stack.back().state;
        if (state == st_objects) {
            this->cur_object = "";
            this->saw_dict = false;
            this->saw_data = false;
            this->saw_datafile = false;
            this->saw_value = false;
            this->saw_stream = false;
        }
    }
}